

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

TRef lj_opt_fwd_aload(jit_State *J)

{
  IRIns *pIVar1;
  ushort uVar2;
  IRIns *pIVar3;
  TRef TVar4;
  ushort uVar5;
  ulong uVar6;
  ushort uVar7;
  ulong uVar8;
  long lVar9;
  IRRef2 IVar10;
  long lVar11;
  IRRef1 *pIVar12;
  
  TVar4 = fwd_ahload(J,(uint)(J->fold).ins.field_0.op1);
  if (TVar4 != 0) {
    return TVar4;
  }
  pIVar3 = (J->cur).ir;
  uVar6 = (ulong)(J->fold).ins.field_0.op1;
  uVar8 = (ulong)*(ushort *)((long)pIVar3 + uVar6 * 8 + 2);
  if ((((*(char *)((long)pIVar3 + uVar8 * 8 + 5) == ')') &&
       (lVar9 = (long)*(short *)((long)pIVar3 + uVar8 * 8 + 2), -1 < lVar9)) &&
      (uVar8 = (ulong)pIVar3[uVar8].field_0.op1, *(char *)((long)pIVar3 + uVar8 * 8 + 5) == ')')) &&
     ((lVar11 = (long)*(short *)((long)pIVar3 + uVar8 * 8 + 2), -1 < lVar11 &&
      (pIVar3[lVar9].field_1.op12 + pIVar3[lVar11].field_1.op12 == 0)))) {
    pIVar12 = J->chain + 0x38;
    uVar5 = (ushort)pIVar3[uVar6].field_1.op12;
    uVar7 = (ushort)pIVar3[uVar8].field_1.op12;
    IVar10 = pIVar3[uVar8].field_1.op12;
    if (uVar7 < uVar5) {
      IVar10 = pIVar3[uVar6].field_1.op12;
    }
    while( true ) {
      uVar2 = *pIVar12;
      if (uVar2 <= (ushort)IVar10) break;
      pIVar1 = pIVar3 + uVar2;
      if (((pIVar1->field_0).op1 == uVar5) && ((pIVar1->field_0).op2 == uVar7)) {
        TVar4 = fwd_ahload(J,(uint)uVar2);
        if (TVar4 != 0) {
          return TVar4;
        }
        break;
      }
      pIVar12 = &(pIVar1->field_0).prev;
    }
  }
  TVar4 = lj_ir_emit(J);
  return TVar4;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_aload(jit_State *J)
{
  IRRef ref;
  if ((ref = fwd_ahload(J, fins->op1)) ||
      (ref = fwd_aload_reassoc(J)))
    return ref;
  return EMITFOLD;
}